

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

_Bool ggml_validate_row_data(ggml_type type,void *data,size_t nbytes)

{
  _Bool _Var1;
  _Bool _Var2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ushort uVar8;
  char *__format;
  ggml_fp16_t *pgVar9;
  ushort *puVar10;
  bool bVar11;
  
  if (type < GGML_TYPE_COUNT) {
    sVar4 = ggml_type_size(type);
    if (nbytes % sVar4 != 0) {
      ggml_validate_row_data_cold_1();
      return false;
    }
    sVar4 = ggml_type_size(type);
    uVar5 = nbytes / sVar4;
    _Var1 = true;
    switch(type) {
    case GGML_TYPE_F32:
      if (sVar4 <= nbytes) {
        sVar4 = 0;
        do {
          _Var1 = validate_float(*(float *)((long)data + sVar4 * 4),sVar4);
          if (!_Var1) {
            return _Var1;
          }
          sVar4 = sVar4 + 1;
        } while (sVar4 < uVar5);
      }
      break;
    case GGML_TYPE_F16:
      if (sVar4 <= nbytes) {
        sVar4 = 0;
        do {
          _Var1 = validate_fp16(*(ggml_fp16_t *)((long)data + sVar4 * 2),sVar4);
          if (!_Var1) {
            return _Var1;
          }
          sVar4 = sVar4 + 1;
        } while (sVar4 < uVar5);
      }
      break;
    case GGML_TYPE_Q4_0:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x12);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_Q4_1:
      if (sVar4 <= nbytes) {
        pgVar9 = (ggml_fp16_t *)((long)data + 2);
        sVar4 = 0;
        do {
          _Var2 = validate_fp16(pgVar9[-1],sVar4);
          if (!_Var2) {
            return false;
          }
          _Var2 = validate_fp16(*pgVar9,sVar4);
          if (!_Var2) {
            return false;
          }
          sVar4 = sVar4 + 1;
          pgVar9 = pgVar9 + 10;
        } while (sVar4 < uVar5);
      }
      break;
    default:
      goto switchD_0013ad45_caseD_4;
    case GGML_TYPE_Q5_0:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x16);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_Q5_1:
      if (sVar4 <= nbytes) {
        pgVar9 = (ggml_fp16_t *)((long)data + 2);
        sVar4 = 0;
        do {
          _Var2 = validate_fp16(pgVar9[-1],sVar4);
          if (!_Var2) {
            return false;
          }
          _Var2 = validate_fp16(*pgVar9,sVar4);
          if (!_Var2) {
            return false;
          }
          sVar4 = sVar4 + 1;
          pgVar9 = pgVar9 + 0xc;
        } while (sVar4 < uVar5);
      }
      break;
    case GGML_TYPE_Q8_0:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x22);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_Q2_K:
      if (sVar4 <= nbytes) {
        pgVar9 = (ggml_fp16_t *)((long)data + 0x52);
        sVar4 = 0;
        do {
          _Var2 = validate_fp16(pgVar9[-1],sVar4);
          if (!_Var2) {
            return false;
          }
          _Var2 = validate_fp16(*pgVar9,sVar4);
          if (!_Var2) {
            return false;
          }
          sVar4 = sVar4 + 1;
          pgVar9 = pgVar9 + 0x2a;
        } while (sVar4 < uVar5);
      }
      break;
    case GGML_TYPE_Q3_K:
      if (sVar4 <= nbytes) {
        pgVar9 = (ggml_fp16_t *)((long)data + 0x6c);
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*pgVar9,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          pgVar9 = pgVar9 + 0x37;
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_Q4_K:
      if (sVar4 <= nbytes) {
        pgVar9 = (ggml_fp16_t *)((long)data + 2);
        sVar4 = 0;
        do {
          _Var2 = validate_fp16(pgVar9[-1],sVar4);
          if (!_Var2) {
            return false;
          }
          _Var2 = validate_fp16(*pgVar9,sVar4);
          if (!_Var2) {
            return false;
          }
          sVar4 = sVar4 + 1;
          pgVar9 = pgVar9 + 0x48;
        } while (sVar4 < uVar5);
      }
      break;
    case GGML_TYPE_Q5_K:
      if (sVar4 <= nbytes) {
        pgVar9 = (ggml_fp16_t *)((long)data + 2);
        sVar4 = 0;
        do {
          _Var2 = validate_fp16(pgVar9[-1],sVar4);
          if (!_Var2) {
            return false;
          }
          _Var2 = validate_fp16(*pgVar9,sVar4);
          if (!_Var2) {
            return false;
          }
          sVar4 = sVar4 + 1;
          pgVar9 = pgVar9 + 0x58;
        } while (sVar4 < uVar5);
      }
      break;
    case GGML_TYPE_Q6_K:
      if (sVar4 <= nbytes) {
        pgVar9 = (ggml_fp16_t *)((long)data + 0xd0);
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*pgVar9,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          pgVar9 = pgVar9 + 0x69;
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_Q8_K:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_float(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x124);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_IQ2_XXS:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x42);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_IQ2_XS:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x4a);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_IQ3_XXS:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x62);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_IQ1_S:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x32);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_IQ4_NL:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x12);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_IQ3_S:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x6e);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_IQ2_S:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x52);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_IQ4_XS:
      if (sVar4 <= nbytes) {
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*data,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          data = (void *)((long)data + 0x88);
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_I8:
    case GGML_TYPE_I16:
    case GGML_TYPE_I32:
    case GGML_TYPE_I64:
      break;
    case GGML_TYPE_F64:
      if (sVar4 <= nbytes) {
        sVar4 = 0;
        do {
          _Var1 = validate_float((float)*(double *)((long)data + sVar4 * 8),sVar4);
          if (!_Var1) {
            return _Var1;
          }
          sVar4 = sVar4 + 1;
        } while (sVar4 < uVar5);
      }
      break;
    case GGML_TYPE_IQ1_M:
      if (sVar4 <= nbytes) {
        puVar10 = (ushort *)((long)data + 0x36);
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*puVar10 & 0xf000 |
                                puVar10[-1] >> 4 & 0xf00 |
                                *(byte *)((long)puVar10 + -3) & 0xfff0 | puVar10[-3] >> 0xc,
                                uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          puVar10 = puVar10 + 0x1c;
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_BF16:
      uVar6 = 0;
      uVar3 = 0;
      if (sVar4 <= nbytes) {
        uVar3 = 0;
        uVar6 = 0;
        uVar7 = 0;
        do {
          uVar8 = *(ushort *)((long)data + uVar7 * 2) & 0x7fff;
          uVar3 = (uVar3 + 1) - (uint)(uVar8 < 0x7f81);
          uVar6 = (ulong)((int)uVar6 + (uint)(uVar8 == 0x7f80));
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar5);
      }
      if (uVar3 == 0) {
        if ((int)uVar6 == 0) {
          return true;
        }
        __format = "%s: found %d infinities in row of %zu BF16 values\n";
      }
      else {
        __format = "%s: found %d NaNs in row of %zu BF16 values\n";
        uVar6 = (ulong)uVar3;
      }
      _Var1 = false;
      fprintf(_stderr,__format,"ggml_validate_row_data",uVar6,uVar5);
      break;
    case GGML_TYPE_TQ1_0:
      if (sVar4 <= nbytes) {
        pgVar9 = (ggml_fp16_t *)((long)data + 0x34);
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*pgVar9,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          pgVar9 = pgVar9 + 0x1b;
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
      break;
    case GGML_TYPE_TQ2_0:
      if (sVar4 <= nbytes) {
        pgVar9 = (ggml_fp16_t *)((long)data + 0x40);
        uVar6 = 1;
        do {
          _Var1 = validate_fp16(*pgVar9,uVar6 - 1);
          if (!_Var1) {
            return _Var1;
          }
          pgVar9 = pgVar9 + 0x21;
          bVar11 = uVar6 < uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar11);
      }
    }
  }
  else {
switchD_0013ad45_caseD_4:
    _Var1 = false;
    fprintf(_stderr,"%s: invalid type %d\n","ggml_validate_row_data",(ulong)type);
  }
  return _Var1;
}

Assistant:

bool ggml_validate_row_data(enum ggml_type type, const void * data, size_t nbytes) {
    if (type < 0 || type >= GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid type %d\n", __func__, type);
        return false;
    }

    if (nbytes % ggml_type_size(type) != 0) {
        fprintf(stderr, "%s: invalid size %zu for type %s (type size = %zu)\n", __func__, nbytes, ggml_type_name(type), ggml_type_size(type));
        return false;
    }

    const size_t nb = nbytes/ggml_type_size(type);

    switch (type) {
        case GGML_TYPE_BF16:
            {
                int nans = 0;
                int infs = 0;
                const unsigned short * f = (const unsigned short *) data;
                for (size_t i = 0; i < nb; ++i) {
                    nans += (f[i] & 0x7fff) > 0x7f80;
                    infs += (f[i] & 0x7fff) == 0x7f80;
                }
                if (nans) {
                    fprintf(stderr, "%s: found %d NaNs in row of %zu BF16 values\n", __func__, nans, nb);
                    return false;
                }
                if (infs) {
                    fprintf(stderr, "%s: found %d infinities in row of %zu BF16 values\n", __func__, infs, nb);
                    return false;
                }
            } break;
        case GGML_TYPE_F16:
            {
                const ggml_fp16_t * f = (const ggml_fp16_t *) data;
                size_t i = 0;
#if defined(__AVX2__)
                for (; i + 15 < nb; i += 16) {
                    __m256i v = _mm256_loadu_si256((const __m256i *)(f + i));
                    __m256i vexp = _mm256_and_si256(v, _mm256_set1_epi16(0x7c00));
                    __m256i cmp = _mm256_cmpeq_epi16(vexp, _mm256_set1_epi16(0x7c00));
                    int mask = _mm256_movemask_epi8(cmp);
                    if (mask) {
                        for (size_t j = 0; j < 16; ++j) {
                            if (!validate_fp16(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#elif defined(__ARM_NEON)
                for (; i + 7 < nb; i += 8) {
                    uint16x8_t v = vld1q_u16(f + i);
                    uint16x8_t vexp = vandq_u16(v, vdupq_n_u16(0x7c00));
                    uint16x8_t cmp = vceqq_u16(vexp, vdupq_n_u16(0x7c00));
                    uint64_t mask = vget_lane_u64(vreinterpret_u64_u8(vshrn_n_u16(cmp, 4)), 0);
                    if (mask) {
                        for (size_t j = 0; j < 8; ++j) {
                            if (!validate_fp16(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#endif
                for (; i < nb; ++i) {
                    if (!validate_fp16(f[i], i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_F32:
            {
                const float * f = (const float *) data;
                size_t i = 0;
#if defined(__AVX2__)
                for (; i + 7 < nb; i += 8) {
                    __m256i v = _mm256_loadu_si256((const __m256i *)(f + i));
                    __m256i vexp = _mm256_and_si256(v, _mm256_set1_epi32(0x7f800000));
                    __m256i cmp = _mm256_cmpeq_epi32(vexp, _mm256_set1_epi32(0x7f800000));
                    int mask = _mm256_movemask_epi8(cmp);
                    if (mask) {
                        for (size_t j = 0; j < 8; ++j) {
                            if (!validate_float(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#elif defined(__ARM_NEON)
                for (; i + 3 < nb; i += 4) {
                    uint32x4_t v = vld1q_u32((const uint32_t *)f + i);
                    uint32x4_t vexp = vandq_u32(v, vdupq_n_u32(0x7f800000));
                    uint32x4_t cmp = vceqq_u32(vexp, vdupq_n_u32(0x7f800000));
                    uint64_t mask = vget_lane_u64(vreinterpret_u64_u16(vshrn_n_u32(cmp, 8)), 0);
                    if (mask) {
                        for (size_t j = 0; j < 4; ++j) {
                            if (!validate_float(f[i + j], i + j)) {
                                return false;
                            }
                        }
                        GGML_UNREACHABLE();
                    }
                }
#endif
                for (; i < nb; ++i) {
                    if (!validate_float(f[i], i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_F64:
            {
                const double * f = (const double *) data;
                for (size_t i = 0; i < nb; ++i) {
                    if (!validate_float(f[i], i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_Q4_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q4_0, data, nb);
            } break;
        case GGML_TYPE_Q4_1:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q4_1, data, nb, d, m);
            } break;
        case GGML_TYPE_Q5_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q5_0, data, nb);
            } break;
        case GGML_TYPE_Q5_1:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q5_1, data, nb, d, m);
            } break;
        case GGML_TYPE_Q8_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q8_0, data, nb);
            } break;
        case GGML_TYPE_Q2_K:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q2_K, data, nb, d, dmin);
            } break;
        case GGML_TYPE_Q3_K:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q3_K, data, nb);
            } break;
        case GGML_TYPE_Q4_K:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q4_K, data, nb, d, dmin);
            } break;
        case GGML_TYPE_Q5_K:
            {
                VALIDATE_ROW_DATA_DM_F16_IMPL(block_q5_K, data, nb, d, dmin);
            } break;
        case GGML_TYPE_Q6_K:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_q6_K, data, nb);
            } break;
        case GGML_TYPE_Q8_K:
            {
                const block_q8_K * q = (const block_q8_K *) data;
                for (size_t i = 0; i < nb; ++i) {
                    if (!validate_float(q[i].d, i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_TQ1_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_tq1_0, data, nb);
            } break;
        case GGML_TYPE_TQ2_0:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_tq2_0, data, nb);
            } break;
        case GGML_TYPE_IQ1_S:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq1_s, data, nb);
            } break;
        case GGML_TYPE_IQ1_M:
            {
                const block_iq1_m * q = (const block_iq1_m *) data;
                for (size_t i = 0; i < nb; ++i) {
                    iq1m_scale_t scale;
                    const uint16_t * sc = (const uint16_t *)q[i].scales;
                    scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);
                    if (!validate_fp16(scale.f16, i)) {
                        return false;
                    }
                }
            } break;
        case GGML_TYPE_IQ2_XXS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq2_xxs, data, nb);
            } break;
        case GGML_TYPE_IQ2_XS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq2_xs, data, nb);
            } break;
        case GGML_TYPE_IQ2_S:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq2_s, data, nb);
            } break;
        case GGML_TYPE_IQ3_XXS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq3_xxs, data, nb);
            } break;

        case GGML_TYPE_IQ3_S:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq3_s, data, nb);
            } break;
        case GGML_TYPE_IQ4_XS:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq4_xs, data, nb);
            } break;
        case GGML_TYPE_IQ4_NL:
            {
                VALIDATE_ROW_DATA_D_F16_IMPL(block_iq4_nl, data, nb);
            } break;

        case GGML_TYPE_I8:
        case GGML_TYPE_I16:
        case GGML_TYPE_I32:
        case GGML_TYPE_I64:
            // nothing to validate
            break;
        default:
            {
                fprintf(stderr, "%s: invalid type %d\n", __func__, type);
                return false;
            }
    }

    return true;
}